

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::matchGlobalVars(ClauseMatcher *this,int *resolvedQueryLit)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar2
  ;
  MatchInfo *bq;
  MatchInfo *pMVar3;
  LitInfo *pLVar4;
  int iVar5;
  MatchInfo **ppMVar6;
  int *piVar7;
  MatchInfo **ppMVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  ILStruct *this_00;
  uint uVar13;
  ulong side;
  long lVar14;
  ulong uVar15;
  ILStruct *this_01;
  uint uVar16;
  uint matchIndex;
  ulong uVar17;
  bool bVar18;
  
  pRVar1 = (this->lms)._cursor;
  pRVar2 = (this->lms)._stack;
  if ((matchGlobalVars(int&)::remaining == '\0') &&
     (iVar5 = __cxa_guard_acquire(&matchGlobalVars(int&)::remaining), iVar5 != 0)) {
    Lib::TriangularArray<int>::TriangularArray(&matchGlobalVars::remaining,10);
    __cxa_atexit(Lib::TriangularArray<int>::~TriangularArray,&matchGlobalVars::remaining,
                 &__dso_handle);
    __cxa_guard_release(&matchGlobalVars(int&)::remaining);
  }
  uVar12 = (int)((ulong)((long)pRVar1 - (long)pRVar2) >> 4) - 1;
  side = (ulong)uVar12;
  Lib::TriangularArray<int>::setSide(&matchGlobalVars::remaining,side);
  piVar7 = matchGlobalVars::remaining._data;
  if (uVar12 != 0) {
    pRVar1 = (this->lms)._stack;
    lVar14 = 0;
    do {
      *(undefined4 *)((long)piVar7 + lVar14) =
           *(undefined4 *)
            ((*(ulong *)**(undefined8 **)
                          ((long)&(pRVar1->_self)._M_t.
                                  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                  .
                                  super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                  ._M_head_impl + lVar14 * 4) >> 3) + 0x34);
      lVar14 = lVar14 + 4;
    } while (side * 4 - lVar14 != 0);
  }
  if (matchGlobalVars(int&)::matchIndex == '\0') {
    matchGlobalVars();
  }
  Lib::DArray<int>::ensure(&matchGlobalVars::matchIndex,side);
  if (uVar12 == 0) {
    uVar12 = 0xffffffff;
LAB_002b79f6:
    *resolvedQueryLit = uVar12;
    return true;
  }
  uVar10 = 0;
LAB_002b77a8:
  matchGlobalVars::matchIndex._array[uVar10] = -1;
  uVar9 = (int)uVar10 + 1;
  uVar17 = uVar10;
  do {
    uVar13 = matchGlobalVars::matchIndex._array[uVar17] + 1;
    matchGlobalVars::matchIndex._array[uVar17] = uVar13;
    if (uVar13 != *(uint *)((long)matchGlobalVars::remaining._data +
                           uVar17 * 4 +
                           ((matchGlobalVars::remaining._2sideMinus1 - uVar17) * uVar17 &
                           0xfffffffffffffffe) * 2)) {
      uVar16 = (int)uVar17 + 1;
      uVar10 = (ulong)uVar16;
      do {
        this_01 = (ILStruct *)
                  (**(ulong **)
                     &((this->lms)._stack[uVar17]._self._M_t.
                       super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
                      _M_head_impl)->super_Matcher >> 3);
        ppMVar6 = CodeTree::ILStruct::getMatch(this_01,uVar13);
        if (uVar12 <= uVar16) {
LAB_002b7977:
          if (uVar12 <= uVar16) {
            *resolvedQueryLit = -1;
            if (this->sres != true) {
              return true;
            }
            lVar14 = 0;
            while( true ) {
              ppMVar6 = CodeTree::ILStruct::getMatch
                                  ((ILStruct *)
                                   (*(ulong *)**(undefined8 **)
                                                ((long)&(((this->lms)._stack)->_self)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                                  .
                                                  super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                                  ._M_head_impl + lVar14 * 4) >> 3),
                                   *(uint *)((long)matchGlobalVars::matchIndex._array + lVar14));
              pLVar4 = (this->lInfos)._array;
              if (pLVar4[*(uint *)*ppMVar6].opposite == true) break;
              lVar14 = lVar14 + 4;
              if (side << 2 == lVar14) {
                return true;
              }
            }
            uVar12 = pLVar4[*(uint *)*ppMVar6].litIndex;
            goto LAB_002b79f6;
          }
          goto LAB_002b77a8;
        }
        bq = *ppMVar6;
        piVar7 = matchGlobalVars::remaining._data;
        sVar11 = matchGlobalVars::remaining._2sideMinus1;
        uVar15 = (ulong)uVar9;
        while (uVar13 = *(uint *)((long)piVar7 +
                                 uVar15 * 4 + ((sVar11 - uVar17) * uVar17 & 0xfffffffffffffffe) * 2)
              , uVar13 != 0) {
          this_00 = (ILStruct *)
                    (**(ulong **)
                       &((this->lms)._stack[uVar15]._self._M_t.
                         super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                         .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
                        _M_head_impl)->super_Matcher >> 3);
          matchIndex = 0;
          do {
            ppMVar6 = CodeTree::ILStruct::getMatch(this_00,matchIndex);
            bVar18 = compatible(this,this_01,bq,this_00,*ppMVar6);
            if (bVar18) {
              matchIndex = matchIndex + 1;
            }
            else {
              uVar13 = uVar13 - 1;
              ppMVar6 = CodeTree::ILStruct::getMatch(this_00,matchIndex);
              ppMVar8 = CodeTree::ILStruct::getMatch(this_00,uVar13);
              pMVar3 = *ppMVar6;
              *ppMVar6 = *ppMVar8;
              *ppMVar8 = pMVar3;
            }
            piVar7 = matchGlobalVars::remaining._data;
            sVar11 = matchGlobalVars::remaining._2sideMinus1;
          } while (matchIndex < uVar13);
          if (uVar13 == 0) break;
          *(uint *)((long)matchGlobalVars::remaining._data +
                   uVar15 * 4 +
                   ((matchGlobalVars::remaining._2sideMinus1 - uVar10) * uVar10 & 0xfffffffffffffffe
                   ) * 2) = uVar13;
          uVar15 = uVar15 + 1;
          if (side <= uVar15) goto LAB_002b7977;
        }
        uVar13 = matchGlobalVars::matchIndex._array[uVar17] + 1;
        matchGlobalVars::matchIndex._array[uVar17] = uVar13;
      } while (uVar13 != *(uint *)((long)matchGlobalVars::remaining._data +
                                  uVar17 * 4 +
                                  ((matchGlobalVars::remaining._2sideMinus1 - uVar17) * uVar17 &
                                  0xfffffffffffffffe) * 2));
    }
    uVar9 = uVar9 - 1;
    bVar18 = uVar17 == 0;
    uVar17 = uVar17 - 1;
    if (bVar18) {
      return false;
    }
  } while( true );
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::matchGlobalVars(int& resolvedQueryLit)
{
  //TODO: perform _set_, not _multiset_ subsumption for subsumption resolution

//  bool verbose=query->number()==58746;
//#define VERB_OUT(x) if(verbose) {cout<<x<<endl;}

  unsigned clen=lms.size()-1;

  //remaining[j,0] contains number of matches for j-th index literal
  //remaining[j,i+1] (for j>i) contains number of matches for j-th
  //  index literal compatible with the bindings of i-th literal (and
  //  those before it)
  //remaining[j,j] therefore contains number of matches we have to try
  //  when we get to binding j-th literal
  //  Matches in ILStruct::matches are reordered, so that we always try
  //  the _first_ remaining[j,j] literals
  static TriangularArray<int> remaining(10);
  remaining.setSide(clen);
  for(unsigned j=0;j<clen;j++) {
    ILStruct* ils=lms[j]->getILS();
    remaining.set(j,0,ils->matchCnt);

//    VERB_OUT("matches "<<ils->matches.size()<<" index:"<<j<<" vars:"<<ils->varCnt<<" linfos:"<<lInfos.size());
//    for(unsigned y=0;y<ils->matches.size();y++) {
//      LitInfo* linf=&lInfos[ils->matches[y]->liIndex];
//      VERB_OUT(" match "<<y<<" liIndex:"<<ils->matches[y]->liIndex<<" op: "<<linf->opposite);
//      VERB_OUT(" hdr: "<<(*linf->ft)[0].number());
//    }
//    for(unsigned x=0;x<ils->varCnt;x++) {
//      VERB_OUT(" glob var: "<<ils->sortedGlobalVarNumbers[x]);
//      for(unsigned y=0;y<ils->matches.size();y++) {
//	VERB_OUT(" match "<<y<<" binding: "<<ils->matches[y]->bindings[x]);
//      }
//    }
  }
//  VERB_OUT("secOp:"<<(lms[1]->op-1)->instr()<<" "<<(lms[1]->op-1)->arg());

  static DArray<int> matchIndex;
  matchIndex.ensure(clen);
  unsigned failLev=0;
  for(unsigned i=0;i<clen;i++) {
    matchIndex[i]=-1;
    if(i>0) { failLev=20; }
  bind_next_match:
    matchIndex[i]++;
    if(matchIndex[i]==remaining.get(i,i)) {
      //no more choices at this level, so try going up
      if(i==0) {
	RSTAT_MCTR_INC("zero level fails at", failLev);
	return false;
      }
      i--;
      goto bind_next_match;
    }
    ASS_L(matchIndex[i],remaining.get(i,i));

    ILStruct* bi=lms[i]->getILS(); 		//bound index literal
    MatchInfo* bq=bi->getMatch(matchIndex[i]);	//bound query literal

    //propagate the implications of this binding to next literals
    for(unsigned j=i+1;j<clen;j++) {
      ILStruct* ni=lms[j]->getILS();		//next index literal
      unsigned rem=remaining.get(j,i);
      unsigned k=0;
      while(k<rem) {
	MatchInfo* nq=ni->getMatch(k);		//next query literal
	if(!compatible(bi,bq,ni,nq)) {
	  rem--;
	  swap(ni->getMatch(k),ni->getMatch(rem));
	  continue;
	}
	k++;
      }
      if(rem==0) {
	if(failLev<j) { failLev=j; }
	goto bind_next_match;
      }
      remaining.set(j,i+1,rem);
    }
  }

  resolvedQueryLit=-1;
  if(sres) {
    for(unsigned i=0;i<clen;i++) {
      ILStruct* ils=lms[i]->getILS();
      MatchInfo* mi=ils->getMatch(matchIndex[i]);
      if(lInfos[mi->liIndex].opposite) {
	resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	break;
      }
    }
  }

  return true;
}